

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O1

void __thiscall f8n::prefs::Preferences::SetBool(Preferences *this,char *key,bool value)

{
  undefined7 in_register_00000011;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,key,&local_39);
  (*(this->super_IPreferences)._vptr_IPreferences[0xe])
            (this,(string *)local_38,CONCAT71(in_register_00000011,value) & 0xffffffff);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void Preferences::SetBool(const char* key, bool value) {
    this->SetBool(std::string(key), value);
}